

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O3

void __thiscall
rsg::DeclarationStatement::DeclarationStatement
          (DeclarationStatement *this,GeneratorState *state,Variable *variable)

{
  Variable **ppVVar1;
  pointer *ppuVar2;
  Storage SVar3;
  iterator __position;
  ConstValueRangeAccess other;
  ConstValueRangeAccess valueRange;
  bool bVar4;
  vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *pvVar5;
  ValueEntry *pVVar6;
  Expression *pEVar7;
  pointer __args;
  Variable *val;
  vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> candidates;
  uint local_10c;
  ValueRange *local_108;
  Scalar *pSStack_100;
  Scalar *local_f8;
  Variable *in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff18 [16];
  __normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
  local_b8;
  iterator iStack_b0;
  Variable **local_a8;
  
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__DeclarationStatement_00786328;
  this->m_variable = (Variable *)0x0;
  this->m_expression = (Expression *)0x0;
  if (variable == (Variable *)0x0) {
    pvVar5 = VariableManager::getLiveVariables(state->m_varManager);
    local_b8._M_current = (Variable **)0x0;
    iStack_b0._M_current = (Variable **)0x0;
    local_a8 = (Variable **)0x0;
    __args = (pvVar5->super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>)._M_impl
             .super__Vector_impl_data._M_start;
    if (__args != (pvVar5->super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish) {
      do {
        if ((*__args)->m_storage == STORAGE_LOCAL) {
          if (iStack_b0._M_current == local_a8) {
            std::vector<rsg::Variable*,std::allocator<rsg::Variable*>>::
            _M_realloc_insert<rsg::Variable*const&>
                      ((vector<rsg::Variable*,std::allocator<rsg::Variable*>> *)&local_b8,iStack_b0,
                       __args);
          }
          else {
            *iStack_b0._M_current = *__args;
            iStack_b0._M_current = iStack_b0._M_current + 1;
          }
        }
        __args = __args + 1;
      } while (__args != (pvVar5->
                         super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>).
                         _M_impl.super__Vector_impl_data._M_finish);
    }
    variable = (Variable *)0x0;
    de::Random::
    choose<__gnu_cxx::__normal_iterator<rsg::Variable**,std::vector<rsg::Variable*,std::allocator<rsg::Variable*>>>,rsg::Variable**>
              (state->m_random,local_b8,
               (__normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
                )iStack_b0._M_current,(Variable **)&stack0xffffffffffffff10,1);
    in_stack_ffffffffffffff10 = variable;
    if (local_b8._M_current != (Variable **)0x0) {
      operator_delete(local_b8._M_current,(long)local_a8 - (long)local_b8._M_current);
    }
  }
  ppVVar1 = &this->m_variable;
  *ppVVar1 = variable;
  pVVar6 = VariableManager::getValue(state->m_varManager,variable);
  if (((*ppVVar1)->m_storage == STORAGE_CONST) ||
     ((((*ppVVar1)->m_storage == STORAGE_LOCAL && (pVVar6 != (ValueEntry *)0x0)) &&
      (valueRange.m_min = (Scalar *)in_stack_ffffffffffffff18._0_8_,
      valueRange.m_max = (Scalar *)in_stack_ffffffffffffff18._8_8_,
      valueRange.m_type = &in_stack_ffffffffffffff10->m_type,
      bVar4 = isUndefinedValueRange(valueRange), !bVar4)))) {
    ExpressionGenerator::ExpressionGenerator((ExpressionGenerator *)&stack0xffffffffffffff10,state);
    local_108 = &pVVar6->m_valueRange;
    pSStack_100 = (pVVar6->m_valueRange).m_min.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_f8 = (pVVar6->m_valueRange).m_max.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (pSStack_100 ==
        (pVVar6->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pSStack_100 = (Scalar *)0x0;
    }
    if (local_f8 ==
        (pVVar6->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_f8 = (Scalar *)0x0;
    }
    other.m_min = pSStack_100;
    other.m_type = &local_108->m_type;
    other.m_max = local_f8;
    ValueRange::ValueRange((ValueRange *)&local_b8,other);
    VariableManager::declareVariable(state->m_varManager,variable);
    SVar3 = (*ppVVar1)->m_storage;
    if (SVar3 == STORAGE_CONST) {
      __position._M_current =
           (state->m_exprFlagStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_10c = __position._M_current[-1] | 1;
      if (__position._M_current ==
          (state->m_exprFlagStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&state->m_exprFlagStack,
                   __position,&local_10c);
      }
      else {
        *__position._M_current = local_10c;
        (state->m_exprFlagStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
    pEVar7 = ExpressionGenerator::generate
                       ((ExpressionGenerator *)&stack0xffffffffffffff10,(ValueRange *)&local_b8,1);
    this->m_expression = pEVar7;
    if (SVar3 == STORAGE_CONST) {
      ppuVar2 = &(state->m_exprFlagStack).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar2 = *ppuVar2 + -1;
    }
    ValueRange::~ValueRange((ValueRange *)&local_b8);
    ExpressionGenerator::~ExpressionGenerator((ExpressionGenerator *)&stack0xffffffffffffff10);
  }
  else {
    VariableManager::declareVariable(state->m_varManager,variable);
  }
  return;
}

Assistant:

DeclarationStatement::DeclarationStatement (GeneratorState& state, Variable* variable)
	: m_variable	(DE_NULL)
	, m_expression	(DE_NULL)
{
	if (variable == DE_NULL)
	{
		// Choose random
		// \todo [2011-02-03 pyry] Allocate a new here?
		// \todo [2011-05-26 pyry] Weights?
		const vector<Variable*>&	liveVars = state.getVariableManager().getLiveVariables();
		vector<Variable*>			candidates;

		for (vector<Variable*>::const_iterator i = liveVars.begin(); i != liveVars.end(); i++)
		{
			if (canDeclareVariable(*i))
				candidates.push_back(*i);
		}

		variable = state.getRandom().choose<Variable*>(candidates.begin(), candidates.end());
	}

	DE_ASSERT(variable);
	m_variable = variable;

	const ValueEntry* value = state.getVariableManager().getValue(variable);

	bool createInitializer = false;

	switch (m_variable->getStorage())
	{
		case Variable::STORAGE_CONST:
			DE_ASSERT(value);
			createInitializer = true;
			break;

		case Variable::STORAGE_LOCAL:
			// \note Currently booleans are always treated as not having undefined range and thus
			//       initializer is always created.
			createInitializer = value && !isUndefinedValueRange(value->getValueRange());
			break;

		default:
			createInitializer = false;
			break;
	}

	if (createInitializer)
	{
		ExpressionGenerator generator(state);

		// Take copy of value range for generating initializer expression
		ValueRange valueRange = value->getValueRange();

		// Declare (removes value entry)
		state.getVariableManager().declareVariable(variable);

		bool isConst = m_variable->getStorage() == Variable::STORAGE_CONST;

		if (isConst)
			state.pushExpressionFlags(state.getExpressionFlags() | CONST_EXPR);

		m_expression = generator.generate(valueRange, 1);

		if (isConst)
			state.popExpressionFlags();
	}
	else
		state.getVariableManager().declareVariable(variable);
}